

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Maybe<kj::Array<capnp::PipelineOp>_> * capnp::_::anon_unknown_0::toPipelineOps(Reader ops)

{
  ListElementCount LVar1;
  ushort uVar2;
  PipelineOp *pPVar3;
  ulong uVar4;
  long lVar5;
  Maybe<kj::Array<capnp::PipelineOp>_> *in_RDI;
  ulong unaff_R13;
  ElementCount index;
  ArrayBuilder<capnp::PipelineOp> result;
  Fault f;
  uint local_64;
  Reader opReader;
  
  uVar4 = (ulong)ops.reader.elementCount;
  index = 0;
  pPVar3 = (PipelineOp *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (8,0,uVar4,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  LVar1 = ops.reader.elementCount;
  result.endPtr = pPVar3 + uVar4;
  result.pos = pPVar3;
  if (ops.reader.elementCount != 0) {
    do {
      ListReader::getStructElement(&opReader._reader,&ops.reader,index);
      if (opReader._reader.dataSize < 0x10) {
        uVar2 = 0;
      }
      else {
        uVar2 = *opReader._reader.data;
      }
      uVar4 = (ulong)uVar2;
      if (uVar2 != 0) {
        if (uVar2 != 1) {
          local_64 = 0;
          if (0xf < opReader._reader.dataSize) {
            local_64 = (uint)*opReader._reader.data;
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25],unsigned_int>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x53,FAILED,(char *)0x0,"\"Unsupported pipeline op.\", (uint)opReader.which()"
                     ,(char (*) [25])"Unsupported pipeline op.",&local_64);
          (in_RDI->ptr).isSet = false;
          kj::_::Debug::Fault::~Fault(&f);
          result.ptr = pPVar3;
          goto LAB_003c761e;
        }
        uVar4 = 1;
        if (opReader._reader.dataSize < 0x20) {
          unaff_R13 = 0;
        }
        else {
          unaff_R13 = (ulong)*(ushort *)((long)opReader._reader.data + 2);
        }
      }
      *result.pos = (RemoveConst<capnp::PipelineOp>)((unaff_R13 & 0xffff) << 0x20 | uVar4);
      result.pos = result.pos + 1;
      index = index + 1;
    } while (LVar1 != index);
  }
  lVar5 = (long)result.pos - (long)pPVar3;
  result.ptr = (PipelineOp *)0x0;
  result.pos = (RemoveConst<capnp::PipelineOp> *)0x0;
  result.endPtr = (PipelineOp *)0x0;
  (in_RDI->ptr).isSet = true;
  (in_RDI->ptr).field_1.value.ptr = pPVar3;
  (in_RDI->ptr).field_1.value.size_ = lVar5 >> 3;
  (in_RDI->ptr).field_1.value.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
LAB_003c761e:
  if (result.ptr != (PipelineOp *)0x0) {
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,result.ptr,8,
               (long)result.pos - (long)result.ptr >> 3,(long)result.endPtr - (long)result.ptr >> 3,
               (_func_void_void_ptr *)0x0);
  }
  return in_RDI;
}

Assistant:

kj::Maybe<kj::Array<PipelineOp>> toPipelineOps(List<rpc::PromisedAnswer::Op>::Reader ops) {
  auto result = kj::heapArrayBuilder<PipelineOp>(ops.size());
  for (auto opReader: ops) {
    PipelineOp op;
    switch (opReader.which()) {
      case rpc::PromisedAnswer::Op::NOOP:
        op.type = PipelineOp::NOOP;
        break;
      case rpc::PromisedAnswer::Op::GET_POINTER_FIELD:
        op.type = PipelineOp::GET_POINTER_FIELD;
        op.pointerIndex = opReader.getGetPointerField();
        break;
      default:
        KJ_FAIL_REQUIRE("Unsupported pipeline op.", (uint)opReader.which()) {
          return nullptr;
        }
    }
    result.add(op);
  }
  return result.finish();
}